

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_negsol.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  void *cvode_mem;
  long lVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  double dVar9;
  SUNContext sunctx;
  int check_negative;
  sunrealtype t;
  undefined8 local_68;
  double local_60;
  undefined4 local_54;
  undefined8 local_50;
  long local_48;
  long *local_40;
  void *local_38;
  
  uVar2 = SUNContext_Create(0,&local_68);
  if ((int)uVar2 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    plVar3 = (long *)N_VNew_Serial(3,local_68);
    if (plVar3 == (long *)0x0) {
      main_cold_5();
      return 1;
    }
    puVar1 = *(undefined8 **)(*plVar3 + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    plVar4 = (long *)N_VNew_Serial(3,local_68);
    if (plVar4 == (long *)0x0) {
      main_cold_4();
      return 1;
    }
    puVar1 = *(undefined8 **)(*plVar4 + 0x10);
    *puVar1 = 0x3e7ad7f29abcaf48;
    puVar1[1] = 0x3d3c25c268497682;
    puVar1[2] = 0x3ee4f8b588e368f1;
    cvode_mem = (void *)CVodeCreate(2,local_68);
    local_38 = cvode_mem;
    if (cvode_mem == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar2 = CVodeInit(0,cvode_mem,f,plVar3);
    if ((int)uVar2 < 0) {
      pcVar7 = "CVodeInit";
    }
    else {
      uVar2 = CVodeSVtolerances(0x3f1a36e2eb1c432d,cvode_mem,plVar4);
      if ((int)uVar2 < 0) {
        pcVar7 = "CVodeSVtolerances";
      }
      else {
        uVar2 = CVodeSetUserData(cvode_mem,&local_54);
        if ((int)uVar2 < 0) {
          pcVar7 = "CVodeSetUserData";
        }
        else {
          lVar5 = SUNDenseMatrix(3,3,local_68);
          if (lVar5 == 0) {
            main_cold_2();
            return 1;
          }
          lVar6 = SUNLinSol_Dense(plVar3,lVar5,local_68);
          if (lVar6 == 0) {
            main_cold_1();
            return 1;
          }
          uVar2 = CVodeSetLinearSolver(cvode_mem,lVar6,lVar5);
          if (-1 < (int)uVar2) {
            local_48 = lVar6;
            local_40 = plVar4;
            puts("Ignore negative solution components\n");
            local_54 = 0;
            dVar9 = 0.4;
            iVar8 = 0xe;
            do {
              local_60 = dVar9;
              CVode(dVar9,cvode_mem,plVar3,&local_50,1);
              puVar1 = *(undefined8 **)(*plVar3 + 0x10);
              printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n",local_50,*puVar1,puVar1[1],
                     puVar1[2]);
              dVar9 = local_60 * 10.0;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            PrintFinalStats(cvode_mem);
            puts("Intercept negative solution components\n");
            local_54 = 1;
            puVar1 = *(undefined8 **)(*plVar3 + 0x10);
            *puVar1 = 0x3ff0000000000000;
            puVar1[1] = 0;
            puVar1[2] = 0;
            CVodeReInit(0,cvode_mem,plVar3);
            dVar9 = 0.4;
            iVar8 = 0xe;
            do {
              local_60 = dVar9;
              CVode(dVar9,cvode_mem,plVar3,&local_50,1);
              puVar1 = *(undefined8 **)(*plVar3 + 0x10);
              printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n",local_50,*puVar1,puVar1[1],
                     puVar1[2]);
              dVar9 = local_60 * 10.0;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            PrintFinalStats(cvode_mem);
            N_VDestroy(plVar3);
            N_VDestroy(local_40);
            CVodeFree(&local_38);
            SUNLinSolFree(local_48);
            SUNMatDestroy(lVar5);
            SUNContext_Free(&local_68);
            return 0;
          }
          pcVar7 = "CVodeSetLinearSolver";
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar7,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  N_Vector abstol;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  sunbooleantype check_negative;

  y         = NULL;
  abstol    = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  NV_Ith_S(y, 0) = Y1;
  NV_Ith_S(y, 1) = Y2;
  NV_Ith_S(y, 2) = Y3;

  /* Set the vector absolute tolerance */
  abstol = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)abstol, "N_VNew_Serial", 0)) { return (1); }

  NV_Ith_S(abstol, 0) = ATOL1;
  NV_Ith_S(abstol, 1) = ATOL2;
  NV_Ith_S(abstol, 2) = ATOL3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSVtolerances to specify the scalar relative tolerance
   * and vector absolute tolerances */
  retval = CVodeSVtolerances(cvode_mem, RTOL, abstol);
  if (check_retval(&retval, "CVodeSVtolerances", 1)) { return (1); }

  /* Call CVodeSetUserData to pass the check negative retval as user data */
  retval = CVodeSetUserData(cvode_mem, &check_negative);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Case 1: ignore negative solution components */
  printf("Ignore negative solution components\n\n");
  check_negative = SUNFALSE;
  /* In loop, call CVode in CV_NORMAL mode */
  iout = 0;
  tout = T1;
  while (1)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    iout++;
    tout *= TMULT;
    if (iout == NOUT) { break; }
  }
  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* Case 2: intercept negative solution components */
  printf("Intercept negative solution components\n\n");
  check_negative = SUNTRUE;
  /* Reinitialize solver */
  NV_Ith_S(y, 0) = Y1;
  NV_Ith_S(y, 1) = Y2;
  NV_Ith_S(y, 2) = Y3;
  retval         = CVodeReInit(cvode_mem, T0, y);
  /* In loop, call CVode in CV_NORMAL mode */
  iout = 0;
  tout = T1;
  while (1)
  {
    CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    iout++;
    tout *= TMULT;
    if (iout == NOUT) { break; }
  }
  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(y);            /* Free y vector */
  N_VDestroy(abstol);       /* Free abstol vector */
  CVodeFree(&cvode_mem);    /* Free CVODE memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}